

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O0

vector<duckdb::MetaBlockPointer,_true> * __thiscall
duckdb::RowVersionManager::Checkpoint(RowVersionManager *this,MetadataManager *manager)

{
  bool bVar1;
  uint uVar2;
  MetadataWriter *pMVar3;
  pointer pCVar4;
  reference ppVar5;
  ChunkInfo *pCVar6;
  MetadataWriter *in_RDX;
  long in_RSI;
  vector<duckdb::MetaBlockPointer,_true> *in_RDI;
  vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
  *this_00;
  ChunkInfo *chunk_info_1;
  unsigned_long *vector_idx_1;
  pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_true> *__range1;
  MetadataWriter writer;
  pointer chunk_info;
  idx_t vector_idx;
  vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_true> to_serialize;
  vector<duckdb::MetaBlockPointer,_true> *in_stack_fffffffffffffee8;
  ChunkInfo *in_stack_fffffffffffffef0;
  MetadataWriter *pMVar7;
  undefined7 in_stack_fffffffffffffef8;
  MetadataManager *in_stack_ffffffffffffff00;
  optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true> written_pointers_p;
  __normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>_>
  local_b8;
  vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
  *local_b0;
  optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true> local_a8;
  undefined1 local_a0 [24];
  vector<duckdb::MetaBlockPointer,_true> *in_stack_ffffffffffffff78;
  MetadataManager *in_stack_ffffffffffffff80;
  MetadataWriter *local_38;
  vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
  local_30;
  MetadataWriter *local_18;
  
  written_pointers_p.ptr = in_RDI;
  local_18 = in_RDX;
  if (((*(byte *)(in_RSI + 0x48) & 1) != 0) ||
     (bVar1 = ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::
              empty((vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_> *)
                    in_stack_ffffffffffffff00), bVar1)) {
    vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_true>::vector
              ((vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_true> *
               )0xbac65c);
    local_38 = (MetadataWriter *)0x0;
    while (pMVar7 = local_38,
          pMVar3 = (MetadataWriter *)
                   ::std::
                   vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                   ::size((vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                           *)(in_RSI + 0x30)), pMVar7 < pMVar3) {
      in_stack_ffffffffffffff00 =
           (MetadataManager *)
           vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                         *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
      pCVar4 = ::std::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>::get
                         ((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_> *)
                          in_stack_fffffffffffffef0);
      if (pCVar4 != (pointer)0x0) {
        uVar2 = (*pCVar4->_vptr_ChunkInfo[8])();
        if ((uVar2 & 1) != 0) {
          ::std::
          vector<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>>>
          ::emplace_back<unsigned_long&,duckdb::ChunkInfo&>
                    ((vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                      *)in_stack_ffffffffffffff00,
                     (unsigned_long *)CONCAT17((char)uVar2,in_stack_fffffffffffffef8),
                     in_stack_fffffffffffffef0);
        }
      }
      local_38 = (MetadataWriter *)((long)&(local_38->super_WriteStream)._vptr_WriteStream + 1);
    }
    bVar1 = ::std::
            vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
            ::empty((vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                     *)in_stack_ffffffffffffff00);
    if (bVar1) {
      memset(written_pointers_p.ptr,0,0x18);
      vector<duckdb::MetaBlockPointer,_true>::vector
                ((vector<duckdb::MetaBlockPointer,_true> *)0xbac774);
    }
    else {
      this_00 = (vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                 *)(in_RSI + 0x50);
      vector<duckdb::MetaBlockPointer,_true>::clear
                ((vector<duckdb::MetaBlockPointer,_true> *)0xbac796);
      optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>::optional_ptr
                (&local_a8,(vector<duckdb::MetaBlockPointer,_true> *)this_00);
      MetadataWriter::MetadataWriter(pMVar7,in_stack_ffffffffffffff00,written_pointers_p);
      ::std::
      vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
      ::size(&local_30);
      WriteStream::Write<unsigned_long>(&local_18->super_WriteStream,(unsigned_long)this_00);
      local_b0 = &local_30;
      local_b8._M_current =
           (pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *)
           ::std::
           vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
           ::begin(this_00);
      ::std::
      vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
      ::end(this_00);
      pMVar7 = local_18;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>_>
                                 *)pMVar7,
                                (__normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>_>
                                 *)this_00), bVar1) {
        ppVar5 = __gnu_cxx::
                 __normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>_>
                 ::operator*(&local_b8);
        pCVar6 = ::std::reference_wrapper<duckdb::ChunkInfo>::get(&ppVar5->second);
        WriteStream::Write<unsigned_long>(&pMVar7->super_WriteStream,(unsigned_long)this_00);
        (*pCVar6->_vptr_ChunkInfo[9])(pCVar6,local_a0);
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>_>
        ::operator++(&local_b8);
      }
      MetadataWriter::Flush(pMVar7);
      *(undefined1 *)(in_RSI + 0x48) = 0;
      vector<duckdb::MetaBlockPointer,_true>::vector
                ((vector<duckdb::MetaBlockPointer,_true> *)pMVar7,
                 (vector<duckdb::MetaBlockPointer,_true> *)this_00);
      MetadataWriter::~MetadataWriter(pMVar7);
    }
    vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_true>::~vector
              ((vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_true> *
               )0xbac8f2);
  }
  else {
    MetadataManager::ClearModifiedBlocks(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    vector<duckdb::MetaBlockPointer,_true>::vector
              ((vector<duckdb::MetaBlockPointer,_true> *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
  }
  return in_RDI;
}

Assistant:

vector<MetaBlockPointer> RowVersionManager::Checkpoint(MetadataManager &manager) {
	if (!has_changes && !storage_pointers.empty()) {
		// the row version manager already exists on disk and no changes were made
		// we can write the current pointer as-is
		// ensure the blocks we are pointing to are not marked as free
		manager.ClearModifiedBlocks(storage_pointers);
		// return the root pointer
		return storage_pointers;
	}
	// first count how many ChunkInfo's we need to deserialize
	vector<pair<idx_t, reference<ChunkInfo>>> to_serialize;
	for (idx_t vector_idx = 0; vector_idx < vector_info.size(); vector_idx++) {
		auto chunk_info = vector_info[vector_idx].get();
		if (!chunk_info) {
			continue;
		}
		if (!chunk_info->HasDeletes()) {
			continue;
		}
		to_serialize.emplace_back(vector_idx, *chunk_info);
	}
	if (to_serialize.empty()) {
		return vector<MetaBlockPointer>();
	}

	storage_pointers.clear();

	MetadataWriter writer(manager, &storage_pointers);
	// now serialize the actual version information
	writer.Write<idx_t>(to_serialize.size());
	for (auto &entry : to_serialize) {
		auto &vector_idx = entry.first;
		auto &chunk_info = entry.second.get();
		writer.Write<idx_t>(vector_idx);
		chunk_info.Write(writer);
	}
	writer.Flush();

	has_changes = false;
	return storage_pointers;
}